

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.hpp
# Opt level: O0

void __thiscall
tcu::ThreadUtil::Operation::modifyObject(Operation *this,SharedPtr<tcu::ThreadUtil::Object> *object)

{
  Object *this_00;
  SharedPtr<tcu::ThreadUtil::Event> local_28;
  SharedPtr<tcu::ThreadUtil::Object> *local_18;
  SharedPtr<tcu::ThreadUtil::Object> *object_local;
  Operation *this_local;
  
  local_18 = object;
  object_local = (SharedPtr<tcu::ThreadUtil::Object> *)this;
  this_00 = de::SharedPtr<tcu::ThreadUtil::Object>::operator->(object);
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&local_28,&this->m_event);
  Object::modify(this_00,&local_28,&this->m_deps);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr(&local_28);
  return;
}

Assistant:

void									modifyObject	(de::SharedPtr<Object> object) { object->modify(m_event, m_deps); }